

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool get_phys_addr_aarch64
                (CPUARMState_conflict *env,target_ulong address,MMUAccessType access_type,
                ARMMMUIdx mmu_idx,hwaddr *phys_ptr,MemTxAttrs *attrs,int *prot,
                target_ulong *page_size,ARMMMUFaultInfo_conflict1 *fi,ARMCacheAttrs *cacheattrs)

{
  MMUAccessType access_type_00;
  target_ulong address_00;
  target_ulong env_00;
  _Bool _Var1;
  int iVar2;
  ARMMMUIdx mmu_idx_00;
  ARMCacheAttrs AVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  ArchCPU_conflict2 *cpu;
  uint64_t uVar7;
  ARMCacheAttrs *local_d8;
  uint local_80;
  int tbi;
  int addrtop;
  uint64_t tcr;
  int pamax;
  int r_el;
  ARMCacheAttrs AStack_5c;
  _Bool ret_1;
  uint local_58;
  ARMCacheAttrs cacheattrs2;
  int ret;
  int s2_prot;
  hwaddr ipa;
  uc_struct_conflict2 *uc;
  MemTxAttrs *attrs_local;
  hwaddr *phys_ptr_local;
  ARMMMUIdx mmu_idx_local;
  MMUAccessType access_type_local;
  target_ulong address_local;
  CPUARMState_conflict *env_local;
  
  ipa = (hwaddr)env->uc;
  uc = (uc_struct_conflict2 *)attrs;
  attrs_local = (MemTxAttrs *)phys_ptr;
  phys_ptr_local._0_4_ = mmu_idx;
  phys_ptr_local._4_4_ = access_type;
  _mmu_idx_local = address;
  address_local = (target_ulong)env;
  if (((mmu_idx == ARMMMUIdx_E10_0) || (mmu_idx == ARMMMUIdx_E10_1)) ||
     (mmu_idx == ARMMMUIdx_E10_1_PAN)) {
    iVar2 = arm_feature(env,0x20);
    env_00 = address_local;
    address_00 = _mmu_idx_local;
    access_type_00 = phys_ptr_local._4_4_;
    if (iVar2 != 0) {
      AStack_5c = (ARMCacheAttrs)0x0;
      mmu_idx_00 = stage_1_mmu_idx((ARMMMUIdx)phys_ptr_local);
      _Var1 = get_phys_addr_aarch64
                        ((CPUARMState_conflict *)env_00,address_00,access_type_00,mmu_idx_00,
                         (hwaddr *)&ret,(MemTxAttrs *)uc,prot,page_size,fi,cacheattrs);
      local_58 = (uint)_Var1;
      if ((local_58 == 0) &&
         (_Var1 = regime_translation_disabled
                            ((CPUARMState_conflict *)address_local,ARMMMUIdx_Stage2), !_Var1)) {
        if (cacheattrs == (ARMCacheAttrs *)0x0) {
          local_d8 = (ARMCacheAttrs *)0x0;
        }
        else {
          local_d8 = &stack0xffffffffffffffa4;
        }
        _Var1 = get_phys_addr_lpae((CPUARMState_conflict *)address_local,_ret,phys_ptr_local._4_4_,
                                   ARMMMUIdx_Stage2,(hwaddr *)attrs_local,(MemTxAttrs *)uc,
                                   (int *)&cacheattrs2,page_size,fi,local_d8);
        local_58 = (uint)_Var1;
        fi->s2addr = _ret;
        *prot = (uint)cacheattrs2 & *prot;
        if ((local_58 == 0) && (cacheattrs != (ARMCacheAttrs *)0x0)) {
          if ((*(ulong *)(address_local + 0x3b8) & 0x1000) != 0) {
            *(ushort *)cacheattrs = *(ushort *)cacheattrs & 0xff00 | 0xff;
            *(ushort *)cacheattrs = *(ushort *)cacheattrs & 0xfcff;
          }
          AVar3 = combine_cacheattrs(*cacheattrs,AStack_5c);
          *cacheattrs = AVar3;
        }
        return local_58 != 0;
      }
      *(target_ulong *)attrs_local = _ret;
      return local_58 != 0;
    }
    phys_ptr_local._0_4_ = stage_1_mmu_idx((ARMMMUIdx)phys_ptr_local);
  }
  _Var1 = regime_is_secure((CPUARMState_conflict *)address_local,(ARMMMUIdx)phys_ptr_local);
  uc->arch = uc->arch & ~UC_ARCH_ARM64 | (uint)_Var1 << 1;
  _Var1 = regime_is_user((CPUARMState_conflict *)address_local,(ARMMMUIdx)phys_ptr_local);
  uc->arch = uc->arch & ~UC_ARCH_X86 | (uint)_Var1 << 2;
  if (((_mmu_idx_local < 0x2000000) && ((ARMMMUIdx)phys_ptr_local != ARMMMUIdx_Stage2)) &&
     (iVar2 = arm_feature((CPUARMState_conflict *)address_local,0x1b), iVar2 == 0)) {
    uVar4 = regime_el((CPUARMState_conflict *)address_local,(ARMMMUIdx)phys_ptr_local);
    if (uVar4 == 3) {
      uVar5 = *(uint *)(address_local + 0x4e8);
    }
    else {
      uVar5 = *(uint *)(address_local + 0x4e4);
    }
    _mmu_idx_local = uVar5 + _mmu_idx_local;
  }
  iVar2 = arm_feature((CPUARMState_conflict *)address_local,7);
  if (iVar2 == 0) {
    _Var1 = regime_translation_disabled
                      ((CPUARMState_conflict *)address_local,(ARMMMUIdx)phys_ptr_local);
    if (_Var1) {
      if ((ARMMMUIdx)phys_ptr_local != ARMMMUIdx_Stage2) {
        uVar4 = regime_el((CPUARMState_conflict *)address_local,(ARMMMUIdx)phys_ptr_local);
        _Var1 = arm_el_is_aa64((CPUARMState_conflict *)address_local,uVar4);
        if (_Var1) {
          cpu = env_archcpu((CPUArchState_conflict1 *)address_local);
          uVar5 = arm_pamax(cpu);
          uVar7 = *(uint64_t *)(address_local + 0x348 + (long)(int)uVar4 * 0x10);
          local_80 = aa64_va_parameter_tbi(uVar7,(ARMMMUIdx)phys_ptr_local);
          if (phys_ptr_local._4_4_ == MMU_INST_FETCH) {
            uVar6 = aa64_va_parameter_tbid(uVar7,(ARMMMUIdx)phys_ptr_local);
            local_80 = (uVar6 ^ 0xffffffff) & local_80;
          }
          uVar7 = extract64(_mmu_idx_local,0x37,1);
          iVar2 = 0x3f;
          if (((int)local_80 >> ((byte)uVar7 & 0x1f) & 1U) != 0) {
            iVar2 = 0x37;
          }
          uVar7 = extract64(_mmu_idx_local,uVar5,(iVar2 - uVar5) + 1);
          if (uVar7 != 0) {
            fi->type = ARMFault_AddressSize;
            fi->level = 0;
            fi->stage2 = false;
            return true;
          }
          _mmu_idx_local = extract64(_mmu_idx_local,0,0x34);
        }
      }
      *(target_ulong *)attrs_local = _mmu_idx_local;
      *prot = 7;
      *page_size = (long)-(int)*(undefined8 *)(*(long *)(ipa + 0x290) + 8);
      env_local._7_1_ = false;
    }
    else {
      _Var1 = regime_using_lpae_format
                        ((CPUARMState_conflict *)address_local,(ARMMMUIdx)phys_ptr_local);
      if (_Var1) {
        env_local._7_1_ =
             get_phys_addr_lpae((CPUARMState_conflict *)address_local,_mmu_idx_local,
                                phys_ptr_local._4_4_,(ARMMMUIdx)phys_ptr_local,(hwaddr *)attrs_local
                                ,(MemTxAttrs *)uc,prot,page_size,fi,cacheattrs);
      }
      else {
        uVar7 = regime_sctlr((CPUARMState_conflict *)address_local,(ARMMMUIdx)phys_ptr_local);
        if ((uVar7 & 0x800000) == 0) {
          env_local._7_1_ =
               get_phys_addr_v5((CPUARMState_conflict *)address_local,(uint32_t)_mmu_idx_local,
                                phys_ptr_local._4_4_,(ARMMMUIdx)phys_ptr_local,(hwaddr *)attrs_local
                                ,prot,page_size,fi);
        }
        else {
          env_local._7_1_ =
               get_phys_addr_v6((CPUARMState_conflict *)address_local,(uint32_t)_mmu_idx_local,
                                phys_ptr_local._4_4_,(ARMMMUIdx)phys_ptr_local,(hwaddr *)attrs_local
                                ,(MemTxAttrs *)uc,prot,page_size,fi);
        }
      }
    }
  }
  else {
    *page_size = (long)-(int)*(undefined8 *)(*(long *)(ipa + 0x290) + 8);
    iVar2 = arm_feature((CPUARMState_conflict *)address_local,0x1b);
    if (iVar2 == 0) {
      iVar2 = arm_feature((CPUARMState_conflict *)address_local,5);
      if (iVar2 == 0) {
        pamax._3_1_ = get_phys_addr_pmsav5
                                ((CPUARMState_conflict *)address_local,(uint32_t)_mmu_idx_local,
                                 phys_ptr_local._4_4_,(ARMMMUIdx)phys_ptr_local,
                                 (hwaddr *)attrs_local,prot,fi);
      }
      else {
        pamax._3_1_ = get_phys_addr_pmsav7
                                ((CPUARMState_conflict *)address_local,(uint32_t)_mmu_idx_local,
                                 phys_ptr_local._4_4_,(ARMMMUIdx)phys_ptr_local,
                                 (hwaddr *)attrs_local,prot,page_size,fi);
      }
    }
    else {
      pamax._3_1_ = get_phys_addr_pmsav8
                              ((CPUARMState_conflict *)address_local,(uint32_t)_mmu_idx_local,
                               phys_ptr_local._4_4_,(ARMMMUIdx)phys_ptr_local,(hwaddr *)attrs_local,
                               (MemTxAttrs *)uc,prot,page_size,fi);
    }
    env_local._7_1_ = pamax._3_1_;
  }
  return env_local._7_1_;
}

Assistant:

bool get_phys_addr(CPUARMState *env, target_ulong address,
                   MMUAccessType access_type, ARMMMUIdx mmu_idx,
                   hwaddr *phys_ptr, MemTxAttrs *attrs, int *prot,
                   target_ulong *page_size,
                   ARMMMUFaultInfo *fi, ARMCacheAttrs *cacheattrs)
{
    struct uc_struct *uc = env->uc;
    if (mmu_idx == ARMMMUIdx_E10_0 ||
        mmu_idx == ARMMMUIdx_E10_1 ||
        mmu_idx == ARMMMUIdx_E10_1_PAN) {
        /* Call ourselves recursively to do the stage 1 and then stage 2
         * translations.
         */
        if (arm_feature(env, ARM_FEATURE_EL2)) {
            hwaddr ipa;
            int s2_prot;
            int ret;
            ARMCacheAttrs cacheattrs2 = { 0 };

            ret = get_phys_addr(env, address, access_type,
                                stage_1_mmu_idx(mmu_idx), &ipa, attrs,
                                prot, page_size, fi, cacheattrs);

            /* If S1 fails or S2 is disabled, return early.  */
            if (ret || regime_translation_disabled(env, ARMMMUIdx_Stage2)) {
                *phys_ptr = ipa;
                return ret;
            }

            /* S1 is done. Now do S2 translation.  */
            ret = get_phys_addr_lpae(env, ipa, access_type, ARMMMUIdx_Stage2,
                                     phys_ptr, attrs, &s2_prot,
                                     page_size, fi,
                                     cacheattrs != NULL ? &cacheattrs2 : NULL);
            fi->s2addr = ipa;
            /* Combine the S1 and S2 perms.  */
            *prot &= s2_prot;

            /* Combine the S1 and S2 cache attributes, if needed */
            if (!ret && cacheattrs != NULL) {
                if (env->cp15.hcr_el2 & HCR_DC) {
                    /*
                     * HCR.DC forces the first stage attributes to
                     *  Normal Non-Shareable,
                     *  Inner Write-Back Read-Allocate Write-Allocate,
                     *  Outer Write-Back Read-Allocate Write-Allocate.
                     */
                    cacheattrs->attrs = 0xff;
                    cacheattrs->shareability = 0;
                }
                *cacheattrs = combine_cacheattrs(*cacheattrs, cacheattrs2);
            }

            return ret;
        } else {
            /*
             * For non-EL2 CPUs a stage1+stage2 translation is just stage 1.
             */
            mmu_idx = stage_1_mmu_idx(mmu_idx);
        }
    }

    /* The page table entries may downgrade secure to non-secure, but
     * cannot upgrade an non-secure translation regime's attributes
     * to secure.
     */
    attrs->secure = regime_is_secure(env, mmu_idx);
    attrs->user = regime_is_user(env, mmu_idx);

    /* Fast Context Switch Extension. This doesn't exist at all in v8.
     * In v7 and earlier it affects all stage 1 translations.
     */
    if (address < 0x02000000 && mmu_idx != ARMMMUIdx_Stage2
        && !arm_feature(env, ARM_FEATURE_V8)) {
        if (regime_el(env, mmu_idx) == 3) {
            address += env->cp15.fcseidr_s;
        } else {
            address += env->cp15.fcseidr_ns;
        }
    }

    if (arm_feature(env, ARM_FEATURE_PMSA)) {
        bool ret;
        *page_size = TARGET_PAGE_SIZE;

        if (arm_feature(env, ARM_FEATURE_V8)) {
            /* PMSAv8 */
            ret = get_phys_addr_pmsav8(env, address, access_type, mmu_idx,
                                       phys_ptr, attrs, prot, page_size, fi);
        } else if (arm_feature(env, ARM_FEATURE_V7)) {
            /* PMSAv7 */
            ret = get_phys_addr_pmsav7(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, page_size, fi);
        } else {
            /* Pre-v7 MPU */
            ret = get_phys_addr_pmsav5(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, fi);
        }
        qemu_log_mask(CPU_LOG_MMU, "PMSA MPU lookup for %s at 0x%08" PRIx32
                      " mmu_idx %u -> %s (prot %c%c%c)\n",
                      access_type == MMU_DATA_LOAD ? "reading" :
                      (access_type == MMU_DATA_STORE ? "writing" : "execute"),
                      (uint32_t)address, mmu_idx,
                      ret ? "Miss" : "Hit",
                      *prot & PAGE_READ ? 'r' : '-',
                      *prot & PAGE_WRITE ? 'w' : '-',
                      *prot & PAGE_EXEC ? 'x' : '-');

        return ret;
    }

    /* Definitely a real MMU, not an MPU */

    if (regime_translation_disabled(env, mmu_idx)) {
        /*
         * MMU disabled.  S1 addresses within aa64 translation regimes are
         * still checked for bounds -- see AArch64.TranslateAddressS1Off.
         */
        if (mmu_idx != ARMMMUIdx_Stage2) {
            int r_el = regime_el(env, mmu_idx);
            if (arm_el_is_aa64(env, r_el)) {
                int pamax = arm_pamax(env_archcpu(env));
                uint64_t tcr = env->cp15.tcr_el[r_el].raw_tcr;
                int addrtop, tbi;

                tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
                if (access_type == MMU_INST_FETCH) {
                    tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
                }
                tbi = (tbi >> extract64(address, 55, 1)) & 1;
                addrtop = (tbi ? 55 : 63);

                if (extract64(address, pamax, addrtop - pamax + 1) != 0) {
                    fi->type = ARMFault_AddressSize;
                    fi->level = 0;
                    fi->stage2 = false;
                    return 1;
                }

                /*
                 * When TBI is disabled, we've just validated that all of the
                 * bits above PAMax are zero, so logically we only need to
                 * clear the top byte for TBI.  But it's clearer to follow
                 * the pseudocode set of addrdesc.paddress.
                 */
                address = extract64(address, 0, 52);
            }
        }
        *phys_ptr = address;
        *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
        *page_size = TARGET_PAGE_SIZE;
        return 0;
    }

    if (regime_using_lpae_format(env, mmu_idx)) {
        return get_phys_addr_lpae(env, address, access_type, mmu_idx,
                                  phys_ptr, attrs, prot, page_size,
                                  fi, cacheattrs);
    } else if (regime_sctlr(env, mmu_idx) & SCTLR_XP) {
        return get_phys_addr_v6(env, address, access_type, mmu_idx,
                                phys_ptr, attrs, prot, page_size, fi);
    } else {
        return get_phys_addr_v5(env, address, access_type, mmu_idx,
                                    phys_ptr, prot, page_size, fi);
    }
}